

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

Nurse * __thiscall
Hospital::Entered_Nurse
          (Hospital *this,string *username,string *password,
          vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses)

{
  _Alloc_hider _Var1;
  int iVar2;
  ulong uVar3;
  pointer pNVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  string local_70;
  string local_50;
  
  pNVar4 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
      super__Vector_impl_data._M_finish != pNVar4) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      Human::User_name_Getter_abi_cxx11_
                (&local_70,(Human *)((long)&(pNVar4->super_Human).Id._M_dataplus._M_p + lVar6));
      if ((local_70._M_string_length == username->_M_string_length) &&
         ((local_70._M_string_length == 0 ||
          (iVar2 = bcmp(local_70._M_dataplus._M_p,(username->_M_dataplus)._M_p,
                        local_70._M_string_length), iVar2 == 0)))) {
        Human::Password_Getter_abi_cxx11_
                  (&local_50,
                   (Human *)((long)&(((All_Of_Nurses->
                                      super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                                      super__Vector_impl_data._M_start)->super_Human).Id._M_dataplus
                            + lVar6));
        _Var1._M_p = local_50._M_dataplus._M_p;
        if (local_50._M_string_length == password->_M_string_length) {
          if (local_50._M_string_length == 0) {
            bVar7 = true;
          }
          else {
            iVar2 = bcmp(local_50._M_dataplus._M_p,(password->_M_dataplus)._M_p,
                         local_50._M_string_length);
            bVar7 = iVar2 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p != &local_50.field_2) {
          operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pNVar4 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar7) goto LAB_0012022b;
      uVar5 = uVar5 + 1;
      uVar3 = ((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar4 >> 3) * -0x7d05f417d05f417d;
      lVar6 = lVar6 + 0x158;
    } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
  }
  uVar5 = 0;
LAB_0012022b:
  return pNVar4 + uVar5;
}

Assistant:

Nurse* Hospital :: Entered_Nurse(string username , string password , vector<Nurse> & All_Of_Nurses){
    int g =0;
    for (int i = 0; i < All_Of_Nurses.size(); ++i) {
        if (All_Of_Nurses[i].User_name_Getter() == username && All_Of_Nurses[i].Password_Getter() == password) {
            g = i;
            break;
        }
    }
    return &All_Of_Nurses[g];
}